

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ipv4_tbl.c
# Opt level: O2

zt_ipv4_node * zt_ipv4_tbl_add_frm_str(zt_ipv4_tbl *tbl,char *netstr)

{
  int iVar1;
  zt_ipv4_node *node;
  zt_ipv4_node *pzVar2;
  
  if (netstr == (char *)0x0 || tbl == (zt_ipv4_tbl *)0x0) {
    return (zt_ipv4_node *)0x0;
  }
  pzVar2 = tbl->any;
  if (tbl->any == (zt_ipv4_node *)0x0) {
    node = zt_ipv4_node_str_init(netstr);
    if (node == (zt_ipv4_node *)0x0) {
      pzVar2 = (zt_ipv4_node *)0x0;
    }
    else {
      iVar1 = zt_ipv4_tbl_add_node(tbl,node);
      pzVar2 = (zt_ipv4_node *)0x0;
      if (iVar1 == 0) {
        pzVar2 = node;
      }
    }
  }
  return pzVar2;
}

Assistant:

zt_ipv4_node   *
zt_ipv4_tbl_add_frm_str(zt_ipv4_tbl * tbl, const char *netstr)
{
    zt_ipv4_node *ipv4_node = NULL;

    if (!tbl || !netstr) {
        return NULL;
    }

    if (tbl->any) {
        /*
         * we had a 0.0.0.0/0, we don't need to insert anything more
         */
        return tbl->any;
    }

    if (!(ipv4_node = zt_ipv4_node_str_init(netstr))) {
        return NULL;
    }

    if (zt_ipv4_tbl_add_node(tbl, ipv4_node)) {
        return NULL;
    }

    return ipv4_node;
}